

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall
olc::PixelGameEngine::FillRectDecal(PixelGameEngine *this,vf2d *pos,vf2d *size,Pixel col)

{
  anon_union_4_2_12391da5_for_Pixel_0 local_58;
  anon_union_4_2_12391da5_for_Pixel_0 aStack_54;
  anon_union_4_2_12391da5_for_Pixel_0 aStack_50;
  anon_union_4_2_12391da5_for_Pixel_0 aStack_4c;
  vf2d local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  vf2d local_20;
  float local_18;
  float local_14;
  float fStack_10;
  float fStack_c;
  float fStack_8;
  float local_4;
  
  local_20 = *pos;
  local_18 = local_20.x;
  fStack_10 = (*size).x + local_18;
  local_4 = local_20.y;
  local_14 = (*size).y + local_4;
  local_38 = 0;
  uStack_30 = 0;
  local_48.x = 0.0;
  local_48.y = 0.0;
  uStack_40 = 0;
  local_58 = col.field_0;
  aStack_54 = col.field_0;
  aStack_50 = col.field_0;
  aStack_4c = col.field_0;
  fStack_c = local_14;
  fStack_8 = fStack_10;
  DrawExplicitDecal(this,(Decal *)0x0,&local_20,&local_48,(Pixel *)&local_58.field_1,4);
  return;
}

Assistant:

void PixelGameEngine::FillRectDecal(const olc::vf2d& pos, const olc::vf2d& size, const olc::Pixel col)
	{
		std::array<olc::vf2d, 4> points = { { {pos}, {pos.x, pos.y + size.y}, {pos + size}, {pos.x + size.x, pos.y} } };
		std::array<olc::vf2d, 4> uvs = { {{0,0},{0,0},{0,0},{0,0}} };
		std::array<olc::Pixel, 4> cols = { {col, col, col, col} };
		DrawExplicitDecal(nullptr, points.data(), uvs.data(), cols.data(), 4);
	}